

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttable.cc
# Opt level: O0

vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
* __thiscall
upb::generator::FastDecodeTable_abi_cxx11_
          (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           *__return_storage_ptr__,generator *this,MessageDefPtr message,DefPoolPair *pools)

{
  bool bVar1;
  reference pFVar2;
  ulong uVar3;
  size_type sVar4;
  unsigned_long *puVar5;
  reference pvVar6;
  int local_104;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_100;
  unsigned_long local_d8 [2];
  size_type local_c8;
  size_t size;
  unsigned_long local_b8;
  int local_ac;
  undefined1 local_a8 [4];
  int slot;
  TableEntry ent;
  FieldDefPtr field;
  __normal_iterator<upb::FieldDefPtr_*,_std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>_>
  local_70;
  iterator __end2;
  iterator __begin2;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> local_48;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *local_30;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> *__range2;
  upb_MessageDef *local_20;
  DefPoolPair *pools_local;
  MessageDefPtr message_local;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *table;
  
  __range2._7_1_ = 0;
  local_20 = message.ptr_;
  pools_local = (DefPoolPair *)this;
  message_local.ptr_ = (upb_MessageDef *)__return_storage_ptr__;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  ::vector(__return_storage_ptr__);
  anon_unknown_0::FieldHotnessOrder(&local_48,(MessageDefPtr)pools_local);
  local_30 = &local_48;
  __end2 = std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::begin(local_30);
  local_70._M_current =
       (FieldDefPtr *)
       std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::end(local_30);
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&local_70), bVar1) {
    pFVar2 = __gnu_cxx::
             __normal_iterator<upb::FieldDefPtr_*,_std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>_>
             ::operator*(&__end2);
    ent.second = (unsigned_long)pFVar2->ptr_;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
                *)local_a8);
    local_b8 = ent.second;
    local_ac = anon_unknown_0::GetTableSlot((FieldDefPtr)ent.second);
    if (-1 < local_ac) {
      size = ent.second;
      bVar1 = anon_unknown_0::TryFillTableEntry
                        ((DefPoolPair *)local_20,(FieldDefPtr)ent.second,(TableEntry *)local_a8);
      if (bVar1) {
        while (uVar3 = (ulong)local_ac,
              sVar4 = std::
                      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      ::size(__return_storage_ptr__), sVar4 <= uVar3) {
          local_d8[1] = 1;
          sVar4 = std::
                  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  ::size(__return_storage_ptr__);
          local_d8[0] = sVar4 * 2;
          puVar5 = std::max<unsigned_long>(local_d8 + 1,local_d8);
          sVar4 = *puVar5;
          local_104 = 0;
          local_c8 = sVar4;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
          ::pair<const_char_(&)[31],_int,_true>
                    (&local_100,(char (*) [31])"_upb_FastDecoder_DecodeGeneric",&local_104);
          std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::resize(__return_storage_ptr__,sVar4,&local_100);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
          ::~pair(&local_100);
        }
        pvVar6 = std::
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::operator[](__return_storage_ptr__,(long)local_ac);
        bVar1 = std::operator!=(&pvVar6->first,"_upb_FastDecoder_DecodeGeneric");
        if (!bVar1) {
          pvVar6 = std::
                   vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   ::operator[](__return_storage_ptr__,(long)local_ac);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
          ::operator=(pvVar6,(type)local_a8);
        }
      }
    }
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
             *)local_a8);
    __gnu_cxx::
    __normal_iterator<upb::FieldDefPtr_*,_std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>_>
    ::operator++(&__end2);
  }
  std::vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<TableEntry> FastDecodeTable(upb::MessageDefPtr message,
                                        const DefPoolPair& pools) {
  std::vector<TableEntry> table;
  for (const auto field : FieldHotnessOrder(message)) {
    TableEntry ent;
    int slot = GetTableSlot(field);
    // std::cerr << "table slot: " << field->number() << ": " << slot << "\n";
    if (slot < 0) {
      // Tag can't fit in the table.
      continue;
    }
    if (!TryFillTableEntry(pools, field, ent)) {
      // Unsupported field type or offset, hasbit index, etc. doesn't fit.
      continue;
    }
    while ((size_t)slot >= table.size()) {
      size_t size = std::max(static_cast<size_t>(1), table.size() * 2);
      table.resize(size, TableEntry{"_upb_FastDecoder_DecodeGeneric", 0});
    }
    if (table[slot].first != "_upb_FastDecoder_DecodeGeneric") {
      // A hotter field already filled this slot.
      continue;
    }
    table[slot] = ent;
  }
  return table;
}